

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error tt_set_mm_blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Bool set_design_coords)

{
  FT_Memory memory_00;
  GX_Blend pGVar1;
  FT_MM_Var *pFVar2;
  bool bVar3;
  bool bVar4;
  FT_Fixed *pFVar5;
  FT_UInt local_84;
  long *plStack_70;
  FT_UInt idx;
  FT_Fixed *n;
  FT_Fixed *c;
  FT_UInt j;
  FT_Bool have_diff;
  anon_enum_32 manageCvt;
  FT_Memory memory;
  FT_Bool all_design_coords;
  FT_UInt i;
  FT_MM_Var *mmvar;
  GX_Blend blend;
  FT_Error error;
  FT_Bool set_design_coords_local;
  FT_Fixed *coords_local;
  TT_Face pTStack_18;
  FT_UInt num_coords_local;
  TT_Face face_local;
  
  blend._0_4_ = 0;
  bVar4 = false;
  memory_00 = (face->root).memory;
  face->doblend = '\0';
  blend._7_1_ = set_design_coords;
  _error = coords;
  coords_local._4_4_ = num_coords;
  pTStack_18 = face;
  if ((face->blend != (GX_Blend)0x0) ||
     (blend._0_4_ = TT_Get_MM_Var(face,(FT_MM_Var **)0x0), (FT_Error)blend == 0)) {
    pGVar1 = pTStack_18->blend;
    pFVar2 = pGVar1->mmvar;
    if (pFVar2->num_axis < coords_local._4_4_) {
      coords_local._4_4_ = pFVar2->num_axis;
    }
    for (memory._4_4_ = 0; memory._4_4_ < coords_local._4_4_; memory._4_4_ = memory._4_4_ + 1) {
      if ((_error[memory._4_4_] < -0x10000) || (0x10000 < _error[memory._4_4_])) {
        return 6;
      }
    }
    if (((pTStack_18->is_cff2 != '\0') || (pGVar1->glyphoffsets != (FT_ULong *)0x0)) ||
       (blend._0_4_ = ft_var_load_gvar(pTStack_18), (FT_Error)blend == 0)) {
      if (pGVar1->coords == (FT_Fixed *)0x0) {
        pFVar5 = (FT_Fixed *)
                 ft_mem_realloc(memory_00,8,0,(ulong)pFVar2->num_axis,(void *)0x0,(FT_Error *)&blend
                               );
        pGVar1->coords = pFVar5;
        if ((FT_Error)blend != 0) {
          return (FT_Error)blend;
        }
        bVar4 = true;
      }
      if (pGVar1->normalizedcoords == (FT_Fixed *)0x0) {
        pFVar5 = (FT_Fixed *)
                 ft_mem_realloc(memory_00,8,0,(ulong)pFVar2->num_axis,(void *)0x0,(FT_Error *)&blend
                               );
        pGVar1->normalizedcoords = pFVar5;
        if ((FT_Error)blend != 0) {
          return (FT_Error)blend;
        }
        j = 1;
      }
      else {
        bVar3 = false;
        j = 0;
        for (memory._4_4_ = 0; memory._4_4_ < coords_local._4_4_; memory._4_4_ = memory._4_4_ + 1) {
          if (pGVar1->normalizedcoords[memory._4_4_] != _error[memory._4_4_]) {
            j = 2;
            bVar3 = true;
            break;
          }
        }
        if (((pTStack_18->root).face_index & 0x7fff0000U) == 0) {
          n = pGVar1->normalizedcoords + memory._4_4_;
          for (c._4_4_ = memory._4_4_; c._4_4_ < pFVar2->num_axis; c._4_4_ = c._4_4_ + 1) {
            if (*n != 0) {
              bVar3 = true;
            }
            n = n + 1;
          }
        }
        else {
          n = pGVar1->normalizedcoords + memory._4_4_;
          plStack_70 = pGVar1->normalized_stylecoords +
                       (ulong)(((uint)((ulong)(pTStack_18->root).face_index >> 0x10) & 0xffff) *
                              pFVar2->num_axis) + (ulong)memory._4_4_;
          for (c._4_4_ = memory._4_4_; c._4_4_ < pFVar2->num_axis; c._4_4_ = c._4_4_ + 1) {
            if (*n != *plStack_70) {
              bVar3 = true;
            }
            plStack_70 = plStack_70 + 1;
            n = n + 1;
          }
        }
        if (!bVar3) {
          return -1;
        }
        for (; memory._4_4_ < pFVar2->num_axis; memory._4_4_ = memory._4_4_ + 1) {
          if (pGVar1->normalizedcoords[memory._4_4_] != 0) {
            j = 2;
            break;
          }
        }
      }
      pGVar1->num_axis = pFVar2->num_axis;
      memcpy(pGVar1->normalizedcoords,_error,(ulong)coords_local._4_4_ << 3);
      if (blend._7_1_ != '\0') {
        if (bVar4) {
          local_84 = pGVar1->num_axis;
        }
        else {
          local_84 = coords_local._4_4_;
        }
        ft_var_to_design(pTStack_18,local_84,pGVar1->normalizedcoords,pGVar1->coords);
      }
      pTStack_18->doblend = '\x01';
      if ((pTStack_18->cvt != (FT_Short *)0x0) && (j != 0)) {
        if (j == 1) {
          blend._0_4_ = tt_face_vary_cvt(pTStack_18,(pTStack_18->root).stream);
        }
        else if (j == 2) {
          ft_mem_free(memory_00,pTStack_18->cvt);
          pTStack_18->cvt = (FT_Short *)0x0;
          pTStack_18->cvt = (FT_Short *)0x0;
          blend._0_4_ = tt_face_load_cvt(pTStack_18,(pTStack_18->root).stream);
        }
      }
      ft_mem_free(memory_00,pTStack_18->postscript_name);
      pTStack_18->postscript_name = (char *)0x0;
      pTStack_18->postscript_name = (char *)0x0;
    }
  }
  return (FT_Error)blend;
}

Assistant:

static FT_Error
  tt_set_mm_blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords,
                   FT_Bool    set_design_coords )
  {
    FT_Error    error = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;

    FT_Bool     all_design_coords = FALSE;

    FT_Memory   memory = face->root.memory;

    enum
    {
      mcvt_retain,
      mcvt_modify,
      mcvt_load

    } manageCvt;


    face->doblend = FALSE;

    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    FT_TRACE5(( "normalized design coordinates:\n" ));

    for ( i = 0; i < num_coords; i++ )
    {
      FT_TRACE5(( "  %.5f\n", coords[i] / 65536.0 ));
      if ( coords[i] < -0x00010000L || coords[i] > 0x00010000L )
      {
        FT_TRACE1(( "TT_Set_MM_Blend: normalized design coordinate %.5f\n"
                    "                 is out of range [-1;1]\n",
                    coords[i] / 65536.0 ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

    FT_TRACE5(( "\n" ));

    if ( !face->is_cff2 && !blend->glyphoffsets )
      if ( FT_SET_ERROR( ft_var_load_gvar( face ) ) )
        goto Exit;

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;

      /* the first time we have to compute all design coordinates */
      all_design_coords = TRUE;
    }

    if ( !blend->normalizedcoords )
    {
      if ( FT_NEW_ARRAY( blend->normalizedcoords, mmvar->num_axis ) )
        goto Exit;

      manageCvt = mcvt_modify;

      /* If we have not set the blend coordinates before this, then the  */
      /* cvt table will still be what we read from the `cvt ' table and  */
      /* we don't need to reload it.  We may need to change it though... */
    }
    else
    {
      FT_Bool    have_diff = 0;
      FT_UInt    j;
      FT_Fixed*  c;
      FT_Fixed*  n;


      manageCvt = mcvt_retain;

      for ( i = 0; i < num_coords; i++ )
      {
        if ( blend->normalizedcoords[i] != coords[i] )
        {
          manageCvt = mcvt_load;
          have_diff = 1;
          break;
        }
      }

      if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
      {
        FT_UInt  idx = (FT_UInt)face->root.face_index >> 16;


        c = blend->normalizedcoords + i;
        n = blend->normalized_stylecoords + idx * mmvar->num_axis + i;
        for ( j = i; j < mmvar->num_axis; j++, n++, c++ )
          if ( *c != *n )
            have_diff = 1;
      }
      else
      {
        c = blend->normalizedcoords + i;
        for ( j = i; j < mmvar->num_axis; j++, c++ )
          if ( *c != 0 )
            have_diff = 1;
      }

      /* return value -1 indicates `no change' */
      if ( !have_diff )
        return -1;

      for ( ; i < mmvar->num_axis; i++ )
      {
        if ( blend->normalizedcoords[i] != 0 )
        {
          manageCvt = mcvt_load;
          break;
        }
      }

      /* If we don't change the blend coords then we don't need to do  */
      /* anything to the cvt table.  It will be correct.  Otherwise we */
      /* no longer have the original cvt (it was modified when we set  */
      /* the blend last time), so we must reload and then modify it.   */
    }

    blend->num_axis = mmvar->num_axis;
    FT_MEM_COPY( blend->normalizedcoords,
                 coords,
                 num_coords * sizeof ( FT_Fixed ) );

    if ( set_design_coords )
      ft_var_to_design( face,
                        all_design_coords ? blend->num_axis : num_coords,
                        blend->normalizedcoords,
                        blend->coords );

    face->doblend = TRUE;

    if ( face->cvt )
    {
      switch ( manageCvt )
      {
      case mcvt_load:
        /* The cvt table has been loaded already; every time we change the */
        /* blend we may need to reload and remodify the cvt table.         */
        FT_FREE( face->cvt );
        face->cvt = NULL;

        error = tt_face_load_cvt( face, face->root.stream );
        break;

      case mcvt_modify:
        /* The original cvt table is in memory.  All we need to do is */
        /* apply the `cvar' table (if any).                           */
        error = tt_face_vary_cvt( face, face->root.stream );
        break;

      case mcvt_retain:
        /* The cvt table is correct for this set of coordinates. */
        break;
      }
    }

    /* enforce recomputation of the PostScript name; */
    FT_FREE( face->postscript_name );
    face->postscript_name = NULL;

  Exit:
    return error;
  }